

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

void __thiscall fasttext::FastText::saveOutput(FastText *this)

{
  byte bVar1;
  invalid_argument *piVar2;
  element_type *peVar3;
  element_type *peVar4;
  ostream *os;
  Dictionary *this_00;
  Vector *this_01;
  ostream *poVar5;
  long in_RDI;
  string word;
  int32_t i;
  Vector vec;
  int32_t n;
  ofstream ofs;
  ostream *in_stack_fffffffffffffce0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffce8;
  char *in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd08;
  int32_t in_stack_fffffffffffffd0c;
  int32_t iVar6;
  int iVar7;
  int32_t in_stack_fffffffffffffd14;
  string local_2c0 [36];
  int lid;
  Dictionary *in_stack_fffffffffffffd68;
  string local_258 [48];
  string local_228 [32];
  ostream local_208 [520];
  
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x169921);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                 in_stack_fffffffffffffd00);
  std::ofstream::ofstream(local_208,local_228,_S_out);
  std::__cxx11::string::~string(local_228);
  bVar1 = std::ofstream::is_open();
  if ((bVar1 & 1) == 0) {
    piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1699a9);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                   in_stack_fffffffffffffd00);
    std::operator+(in_stack_fffffffffffffce8,(char *)in_stack_fffffffffffffce0);
    std::invalid_argument::invalid_argument(piVar2,local_258);
    __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  if ((*(byte *)(in_RDI + 0x88) & 1) != 0) {
    piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (piVar2,"Option -saveOutput is not supported for quantized models.");
    __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  peVar3 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x169b4c);
  if (peVar3->model == sup) {
    peVar4 = std::
             __shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x169b60);
    in_stack_fffffffffffffd14 = Dictionary::nlabels(peVar4);
    iVar6 = in_stack_fffffffffffffd14;
  }
  else {
    peVar4 = std::
             __shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x169b86);
    in_stack_fffffffffffffd0c = Dictionary::nwords(peVar4);
    iVar6 = in_stack_fffffffffffffd0c;
  }
  iVar7 = iVar6;
  os = (ostream *)std::ostream::operator<<(local_208,iVar6);
  this_00 = (Dictionary *)std::operator<<(os," ");
  peVar3 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x169be6);
  this_01 = (Vector *)std::ostream::operator<<(this_00,peVar3->dim);
  std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x169c17);
  Vector::Vector((Vector *)CONCAT44(in_stack_fffffffffffffd14,iVar7),
                 CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
  for (lid = 0; lid < iVar6; lid = lid + 1) {
    peVar3 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x169c53);
    if (peVar3->model == sup) {
      std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x169c67);
      Dictionary::getLabel_abi_cxx11_(in_stack_fffffffffffffd68,lid);
    }
    else {
      std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x169c8d);
      Dictionary::getWord_abi_cxx11_(this_00,(int32_t)((ulong)this_01 >> 0x20));
    }
    Vector::zero(this_01);
    std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
              ((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_fffffffffffffce0);
    Vector::addRow((Vector *)CONCAT44(in_stack_fffffffffffffd14,iVar7),
                   (Matrix *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                   (int64_t)os);
    poVar5 = std::operator<<(local_208,local_2c0);
    in_stack_fffffffffffffce0 = std::operator<<(poVar5," ");
    poVar5 = operator<<(os,(Vector *)this_00);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_2c0);
  }
  std::ofstream::close();
  Vector::~Vector((Vector *)0x169da9);
  std::ofstream::~ofstream(local_208);
  return;
}

Assistant:

void FastText::saveOutput() {
  std::ofstream ofs(args_->output + ".output");
  if (!ofs.is_open()) {
    throw std::invalid_argument(
        args_->output + ".output" + " cannot be opened for saving vectors!");
  }
  if (quant_) {
    throw std::invalid_argument(
        "Option -saveOutput is not supported for quantized models.");
  }
  int32_t n = (args_->model == model_name::sup) ? dict_->nlabels()
                                                : dict_->nwords();
  ofs << n << " " << args_->dim << std::endl;
  Vector vec(args_->dim);
  for (int32_t i = 0; i < n; i++) {
    std::string word = (args_->model == model_name::sup) ? dict_->getLabel(i)
                                                         : dict_->getWord(i);
    vec.zero();
    vec.addRow(*output_, i);
    ofs << word << " " << vec << std::endl;
  }
  ofs.close();
}